

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O1

void dirNexClose(void)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  fullpath_ref_t fname;
  FILE *__stream;
  void *__s;
  size_t __n;
  size_t sVar4;
  
  if (!nex.canAppend) {
    Error("[SAVENEX] NEX file is not open",(char *)0x0,SUPPRESS);
    return;
  }
  SNexFile::updateIfAheadFirstBankSave(&nex);
  __s = (void *)0x0;
  do {
    iVar3 = SkipBlanks(&lp);
    if (iVar3 != 0) break;
    fname = GetInputFile(&lp);
    cVar1 = std::filesystem::__cxx11::path::has_filename();
    if (cVar1 != '\0') {
      __stream = (FILE *)SJ_fopen(&fname->full,"rb");
      if (__stream == (FILE *)0x0) {
        Error("[SAVENEX] Error opening append file",(fname->str)._M_dataplus._M_p,SUPPRESS);
      }
      else {
        if (__s == (void *)0x0) {
          __s = operator_new__(0x4000);
          memset(__s,0,0x4000);
        }
        do {
          __n = fread(__s,1,0x4000,__stream);
          if (__n != 0) {
            sVar4 = fwrite(__s,1,__n,(FILE *)nex.f);
            if (sVar4 != __n) {
              Error("[SAVENEX] writing append data failed",(char *)0x0,FATAL);
            }
          }
          iVar3 = feof(__stream);
        } while (iVar3 == 0);
        fclose(__stream);
      }
    }
    bVar2 = comma(&lp);
  } while (bVar2);
  SNexFile::finalizeFile(&nex);
  if (__s != (void *)0x0) {
    operator_delete__(__s);
    return;
  }
  return;
}

Assistant:

static void dirNexClose() {
	if (!nex.canAppend) {
		Error("[SAVENEX] NEX file is not open", NULL, SUPPRESS);
		return;
	}
	// update V1.3 banksOffset in case there was no bank stored at all (before appending binary data!)
	nex.updateIfAheadFirstBankSave();
	// read CLOSE command arguments and try to append the proposed files (if some were provided)
	static constexpr int copyBufSize = 0x4000;
	std::unique_ptr<byte[]> copyBuffer;		// Lazily allocated buffer (if needed)
	while (!SkipBlanks(lp)) {
		fullpath_ref_t appendIn = GetInputFile(lp);
		if (appendIn.full.has_filename()) {	// some append file requested, try to copy its content at tail of NEX
			FILE* appendF = nullptr;
			if (!FOPEN_ISOK(appendF, appendIn.full, "rb")) {
				Error("[SAVENEX] Error opening append file", appendIn.str.c_str(), SUPPRESS);
			} else {
				if (!copyBuffer) copyBuffer = std::make_unique<byte[]>(copyBufSize);
				do {
					const size_t read = fread(copyBuffer.get(), 1, copyBufSize, appendF);
					if (read) {
						const size_t write = fwrite(copyBuffer.get(), 1, read, nex.f);
						if (write != read) Error("[SAVENEX] writing append data failed", NULL, FATAL);
					}
				} while (!feof(appendF));
				fclose(appendF);
			}
		}
		if (!comma(lp)) break;
	}
	// finalize the NEX file (refresh the header data and close it)
	nex.finalizeFile();
}